

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# egl_context.c
# Opt level: O3

GLFWbool chooseEGLConfig(_GLFWctxconfig *ctxconfig,_GLFWfbconfig *desired,EGLConfig *result)

{
  EGLConfig pvVar1;
  ulong uVar2;
  GLFWbool GVar3;
  uint uVar4;
  EGLConfig *block;
  XVisualInfo *pXVar5;
  _GLFWfbconfig *p_Var6;
  long lVar7;
  int nativeCount;
  int value_2;
  int value;
  int local_a0;
  int local_9c;
  _GLFWfbconfig *local_98;
  _GLFWctxconfig *local_90;
  XVisualInfo local_88;
  _GLFWfbconfig *local_40;
  EGLConfig *local_38;
  
  uVar4 = 0;
  local_90 = ctxconfig;
  (*_glfw.egl.GetConfigs)(_glfw.egl.display,(EGLConfig *)0x0,0,&local_a0);
  if ((long)local_a0 == 0) {
    uVar4 = 0;
    _glfwInputError(0x10006,"EGL: No EGLConfigs returned");
  }
  else {
    local_38 = result;
    block = (EGLConfig *)_glfw_calloc((long)local_a0,8);
    (*_glfw.egl.GetConfigs)(_glfw.egl.display,block,local_a0,&local_a0);
    local_98 = (_GLFWfbconfig *)_glfw_calloc((long)local_a0,0x48);
    if (0 < local_a0) {
      lVar7 = 0;
      uVar4 = 0;
      local_40 = desired;
      do {
        pvVar1 = block[lVar7];
        (*_glfw.egl.GetConfigAttrib)(_glfw.egl.display,pvVar1,0x303f,(EGLint *)&local_88);
        if (((int)local_88.visual == 0x308e) &&
           ((*_glfw.egl.GetConfigAttrib)(_glfw.egl.display,pvVar1,0x3033,(EGLint *)&local_88),
           ((ulong)local_88.visual & 4) != 0)) {
          p_Var6 = local_98 + (int)uVar4;
          if (_glfw.platform.platformID == 0x60004) {
            local_88.blue_mask = 0;
            local_88.colormap_size = 0;
            local_88.bits_per_rgb = 0;
            local_88.red_mask = 0;
            local_88.green_mask = 0;
            local_88.screen = 0;
            local_88.depth = 0;
            local_88.class = 0;
            local_88._28_4_ = 0;
            local_88.visual = (Visual *)0x0;
            local_88.visualid = 0;
            (*_glfw.egl.GetConfigAttrib)(_glfw.egl.display,pvVar1,0x302e,&local_9c);
            local_88.visualid = (VisualID)local_9c;
            if (local_88.visualid == 0) goto LAB_0012a31f;
            if ((desired->transparent != 0) &&
               (pXVar5 = (*_glfw.x11.xlib.GetVisualInfo)(_glfw.x11.display,1,&local_88,&local_9c),
               desired = local_40, pXVar5 != (XVisualInfo *)0x0)) {
              GVar3 = _glfwIsVisualTransparentX11(pXVar5->visual);
              p_Var6->transparent = GVar3;
              (*_glfw.x11.xlib.Free)(pXVar5);
              desired = local_40;
            }
          }
          if (local_90->client == 0x30001) {
            (*_glfw.egl.GetConfigAttrib)(_glfw.egl.display,pvVar1,0x3040,(EGLint *)&local_88);
            uVar2 = (ulong)local_88.visual & 8;
joined_r0x0012a350:
            if (uVar2 == 0) goto LAB_0012a31f;
          }
          else if (local_90->client == 0x30002) {
            if (local_90->major == 1) {
              (*_glfw.egl.GetConfigAttrib)(_glfw.egl.display,pvVar1,0x3040,(EGLint *)&local_88);
              uVar2 = (ulong)local_88.visual & 1;
            }
            else {
              (*_glfw.egl.GetConfigAttrib)(_glfw.egl.display,pvVar1,0x3040,(EGLint *)&local_88);
              uVar2 = (ulong)local_88.visual & 4;
            }
            goto joined_r0x0012a350;
          }
          (*_glfw.egl.GetConfigAttrib)(_glfw.egl.display,pvVar1,0x3024,(EGLint *)&local_88);
          p_Var6->redBits = (int)local_88.visual;
          (*_glfw.egl.GetConfigAttrib)(_glfw.egl.display,pvVar1,0x3023,(EGLint *)&local_88);
          p_Var6->greenBits = (int)local_88.visual;
          (*_glfw.egl.GetConfigAttrib)(_glfw.egl.display,pvVar1,0x3022,(EGLint *)&local_88);
          p_Var6->blueBits = (int)local_88.visual;
          (*_glfw.egl.GetConfigAttrib)(_glfw.egl.display,pvVar1,0x3021,(EGLint *)&local_88);
          p_Var6->alphaBits = (int)local_88.visual;
          (*_glfw.egl.GetConfigAttrib)(_glfw.egl.display,pvVar1,0x3025,(EGLint *)&local_88);
          p_Var6->depthBits = (int)local_88.visual;
          (*_glfw.egl.GetConfigAttrib)(_glfw.egl.display,pvVar1,0x3026,(EGLint *)&local_88);
          p_Var6->stencilBits = (int)local_88.visual;
          (*_glfw.egl.GetConfigAttrib)(_glfw.egl.display,pvVar1,0x3031,(EGLint *)&local_88);
          p_Var6->samples = (int)local_88.visual;
          p_Var6->doublebuffer = desired->doublebuffer;
          p_Var6->handle = (uintptr_t)pvVar1;
          uVar4 = uVar4 + 1;
        }
LAB_0012a31f:
        lVar7 = lVar7 + 1;
      } while (lVar7 < local_a0);
    }
    p_Var6 = _glfwChooseFBConfig(desired,local_98,uVar4);
    if (p_Var6 != (_GLFWfbconfig *)0x0) {
      *local_38 = (EGLConfig)p_Var6->handle;
    }
    uVar4 = (uint)(p_Var6 != (_GLFWfbconfig *)0x0);
    _glfw_free(block);
    _glfw_free(local_98);
  }
  return uVar4;
}

Assistant:

static GLFWbool chooseEGLConfig(const _GLFWctxconfig* ctxconfig,
                                const _GLFWfbconfig* desired,
                                EGLConfig* result)
{
    EGLConfig* nativeConfigs;
    _GLFWfbconfig* usableConfigs;
    const _GLFWfbconfig* closest;
    int i, nativeCount, usableCount;

    eglGetConfigs(_glfw.egl.display, NULL, 0, &nativeCount);
    if (!nativeCount)
    {
        _glfwInputError(GLFW_API_UNAVAILABLE, "EGL: No EGLConfigs returned");
        return GLFW_FALSE;
    }

    nativeConfigs = _glfw_calloc(nativeCount, sizeof(EGLConfig));
    eglGetConfigs(_glfw.egl.display, nativeConfigs, nativeCount, &nativeCount);

    usableConfigs = _glfw_calloc(nativeCount, sizeof(_GLFWfbconfig));
    usableCount = 0;

    for (i = 0;  i < nativeCount;  i++)
    {
        const EGLConfig n = nativeConfigs[i];
        _GLFWfbconfig* u = usableConfigs + usableCount;

        // Only consider RGB(A) EGLConfigs
        if (getEGLConfigAttrib(n, EGL_COLOR_BUFFER_TYPE) != EGL_RGB_BUFFER)
            continue;

        // Only consider window EGLConfigs
        if (!(getEGLConfigAttrib(n, EGL_SURFACE_TYPE) & EGL_WINDOW_BIT))
            continue;

#if defined(_GLFW_X11)
        if (_glfw.platform.platformID == GLFW_PLATFORM_X11)
        {
            XVisualInfo vi = {0};

            // Only consider EGLConfigs with associated Visuals
            vi.visualid = getEGLConfigAttrib(n, EGL_NATIVE_VISUAL_ID);
            if (!vi.visualid)
                continue;

            if (desired->transparent)
            {
                int count;
                XVisualInfo* vis =
                    XGetVisualInfo(_glfw.x11.display, VisualIDMask, &vi, &count);
                if (vis)
                {
                    u->transparent = _glfwIsVisualTransparentX11(vis[0].visual);
                    XFree(vis);
                }
            }
        }
#endif // _GLFW_X11

        if (ctxconfig->client == GLFW_OPENGL_ES_API)
        {
            if (ctxconfig->major == 1)
            {
                if (!(getEGLConfigAttrib(n, EGL_RENDERABLE_TYPE) & EGL_OPENGL_ES_BIT))
                    continue;
            }
            else
            {
                if (!(getEGLConfigAttrib(n, EGL_RENDERABLE_TYPE) & EGL_OPENGL_ES2_BIT))
                    continue;
            }
        }
        else if (ctxconfig->client == GLFW_OPENGL_API)
        {
            if (!(getEGLConfigAttrib(n, EGL_RENDERABLE_TYPE) & EGL_OPENGL_BIT))
                continue;
        }

        u->redBits = getEGLConfigAttrib(n, EGL_RED_SIZE);
        u->greenBits = getEGLConfigAttrib(n, EGL_GREEN_SIZE);
        u->blueBits = getEGLConfigAttrib(n, EGL_BLUE_SIZE);

        u->alphaBits = getEGLConfigAttrib(n, EGL_ALPHA_SIZE);
        u->depthBits = getEGLConfigAttrib(n, EGL_DEPTH_SIZE);
        u->stencilBits = getEGLConfigAttrib(n, EGL_STENCIL_SIZE);

        u->samples = getEGLConfigAttrib(n, EGL_SAMPLES);
        u->doublebuffer = desired->doublebuffer;

        u->handle = (uintptr_t) n;
        usableCount++;
    }

    closest = _glfwChooseFBConfig(desired, usableConfigs, usableCount);
    if (closest)
        *result = (EGLConfig) closest->handle;

    _glfw_free(nativeConfigs);
    _glfw_free(usableConfigs);

    return closest != NULL;
}